

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trigonometric.hpp
# Opt level: O3

Vector4<mt::Dual<float>_> * __thiscall
mt::logLerpUnit<mt::Dual<float>,float>
          (Vector4<mt::Dual<float>_> *__return_storage_ptr__,mt *this,Vector4<mt::Dual<float>_> *u1,
          Vector4<mt::Dual<float>_> *u2,float t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float in_XMM0_Db;
  float extraout_XMM0_Db;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar11;
  float fVar12;
  undefined1 auVar10 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float fStack_f0;
  float fStack_ec;
  float local_d0;
  float local_cc;
  float local_c8;
  float fStack_c4;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 local_38 [16];
  
  local_48 = *(float *)this;
  fStack_44 = *(float *)(this + 8);
  fVar15 = *(float *)(this + 0x10);
  fStack_3c = *(float *)(this + 0x18);
  local_38 = ZEXT416((uint)fStack_3c);
  fVar11 = fStack_44 * fStack_44;
  auVar10._4_4_ = fVar11;
  auVar10._0_4_ = fVar11;
  auVar10._8_4_ = fVar11;
  auVar10._12_4_ = fVar11;
  auVar5._4_12_ = auVar10._4_12_;
  auVar5._0_4_ = fVar11 + local_48 * local_48 + fVar15 * fVar15;
  if (auVar5._0_4_ == 0.0) {
    fStack_104 = fStack_44;
    local_108 = local_48;
    fStack_100 = fVar15;
    fStack_fc = fStack_3c;
    fVar11 = fVar15;
  }
  else {
    auVar10 = rsqrtss(ZEXT816(0),auVar5);
    fVar11 = auVar10._0_4_;
    fVar8 = fVar11 * -0.5 * (auVar5._0_4_ * fVar11 * fVar11 + -3.0);
    fVar11 = fVar15 * fVar8;
    fStack_104 = fVar8 * fStack_44;
    local_108 = fVar8 * local_48;
    fStack_100 = fVar8 * fVar15;
    fStack_fc = fVar8 * fStack_3c;
  }
  fVar8 = 1.0;
  if (fStack_3c <= 1.0) {
    fVar8 = fStack_3c;
  }
  local_c8 = t;
  fStack_c4 = in_XMM0_Db;
  fStack_40 = fVar15;
  acosf((float)(~-(uint)(fStack_3c < -1.0) & (uint)fVar8 | -(uint)(fStack_3c < -1.0) & 0xbf800000));
  local_98 = (u1->x).mReal;
  fStack_94 = (u1->y).mReal;
  fVar8 = (u1->z).mReal;
  fStack_8c = (u1->w).mReal;
  local_78 = ZEXT416((uint)fStack_8c);
  fVar12 = fStack_94 * fStack_94;
  auVar6._4_4_ = fVar12;
  auVar6._0_4_ = fVar12;
  auVar6._8_4_ = fVar12;
  auVar6._12_4_ = fVar12;
  auVar7._4_12_ = auVar6._4_12_;
  auVar7._0_4_ = fVar12 + local_98 * local_98 + fVar8 * fVar8;
  local_118 = local_98;
  fStack_114 = fStack_94;
  fStack_110 = fVar8;
  fStack_10c = fStack_8c;
  if (auVar7._0_4_ != 0.0) {
    auVar10 = rsqrtss(ZEXT816(0),auVar7);
    fVar12 = auVar10._0_4_;
    fVar12 = fVar12 * -0.5 * (auVar7._0_4_ * fVar12 * fVar12 + -3.0);
    local_118 = fVar12 * local_98;
    fStack_114 = fVar12 * fStack_94;
    fStack_110 = fVar12 * fVar8;
    fStack_10c = fVar12 * fStack_8c;
  }
  local_68 = *(undefined8 *)(this + 4);
  uStack_60 = *(undefined8 *)(this + 0xc);
  local_58 = ZEXT416(*(uint *)(this + 0x14));
  local_88 = ZEXT416(*(uint *)(this + 0x1c));
  fVar12 = fStack_8c;
  if (1.0 <= fStack_8c) {
    fVar12 = 1.0;
  }
  fStack_90 = fVar8;
  fVar4 = acosf((float)(-(uint)(fStack_8c < -1.0) & 0xbf800000 |
                       ~-(uint)(fStack_8c < -1.0) & (uint)fVar12));
  fVar14 = local_c8;
  fVar2 = (u1->x).mDual;
  fVar3 = (u1->y).mDual;
  fVar12 = (u1->z).mDual;
  fVar1 = (u1->w).mDual;
  fVar9 = 1.0 - local_c8;
  fVar4 = fVar4 * local_c8;
  fVar13 = fVar9 * 0.0;
  fVar11 = fVar11 * fVar13;
  local_b8 = fVar4 * local_118 + fVar13 * local_108;
  fStack_b4 = fVar4 * fStack_114 + fVar13 * fStack_104;
  fStack_b0 = fVar4 * fStack_110 + fVar13 * fStack_100;
  fStack_ac = fVar4 * fStack_10c + fVar13 * fStack_fc;
  local_a8 = fVar11 + fStack_110 * fVar4;
  fStack_a4 = fVar11 + fVar11;
  fStack_a0 = fVar11 + fStack_f0 * extraout_XMM0_Db * fStack_c4;
  fStack_9c = fVar11 + fStack_ec * 0.0;
  fVar11 = SQRT(local_a8 * local_a8 + fStack_b4 * fStack_b4 + local_b8 * local_b8);
  if (fVar11 == 0.0) {
    local_b8 = 0.0;
    fStack_b4 = 0.0;
    local_cc = 0.0;
    local_d0 = 1.0;
  }
  else {
    sincosf(fVar11,&local_cc,&local_d0);
    local_cc = local_cc / fVar11;
    local_b8 = local_cc * local_b8;
    fStack_b4 = local_cc * fStack_b4;
    local_cc = local_cc * local_a8;
  }
  fStack_94 = -fStack_94;
  fVar8 = -fVar8;
  fStack_44 = -fStack_44;
  fVar15 = -fVar15;
  fVar11 = fVar9 * (fStack_44 * (float)local_88._0_4_ +
                   (((float)local_38._0_4_ * (float)uStack_60 - fVar15 * (float)local_68) -
                   (float)local_58._0_4_ * local_48)) +
           fVar14 * (fStack_94 * fVar1 +
                    (((float)local_78._0_4_ * fVar3 - fVar8 * fVar2) - fVar12 * local_98));
  fVar14 = local_c8 *
           ((fVar2 * (float)local_78._0_4_ + -local_98 * fVar1 + fVar8 * fVar3) - fVar12 * fStack_94
           ) + (((float)local_68 * (float)local_38._0_4_ + -local_48 * (float)local_88._0_4_ +
                fVar15 * (float)uStack_60) - (float)local_58._0_4_ * fStack_44) * fVar9;
  fVar15 = local_c8 *
           (fStack_94 * fVar2 + fVar12 * (float)local_78._0_4_ + fVar3 * local_98 + fVar8 * fVar1) +
           (fStack_44 * (float)local_68 +
           (float)local_58._0_4_ * (float)local_38._0_4_ +
           (float)uStack_60 * local_48 + fVar15 * (float)local_88._0_4_) * fVar9;
  (__return_storage_ptr__->x).mReal = local_b8;
  (__return_storage_ptr__->x).mDual = (local_d0 * fVar14 + fVar11 * local_cc) - fStack_b4 * fVar15;
  (__return_storage_ptr__->y).mReal = fStack_b4;
  (__return_storage_ptr__->y).mDual = (local_b8 * fVar15 + fVar11 * local_d0) - local_cc * fVar14;
  (__return_storage_ptr__->z).mReal = local_cc;
  (__return_storage_ptr__->z).mDual = (fStack_b4 * fVar14 + local_d0 * fVar15) - fVar11 * local_b8;
  (__return_storage_ptr__->w).mReal = local_d0;
  (__return_storage_ptr__->w).mDual = -(fVar15 * local_cc + fVar14 * local_b8 + fStack_b4 * fVar11);
  return __return_storage_ptr__;
}

Assistant:

Vector4<Scalar1> logLerpUnit(const Vector4<Scalar1>& u1, const Vector4<Scalar1>& u2, Scalar2 t)
    {
        return exp(lerp(logUnit(u1), logUnit(u2), t));  
    }